

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O0

Gia_Man_t * Gia_ManDupNormalize(Gia_Man_t *p,int fHashMapping)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Gia_Man_t *p_00;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  bool bVar8;
  int nPis;
  int nAll;
  int nCIs;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  int fHashMapping_local;
  Gia_Man_t *p_local;
  
  Gia_ManFillValue(p);
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar6 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar6;
  pcVar6 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar6;
  pGVar7 = Gia_ManConst0(p);
  pGVar7->Value = 0;
  iVar1 = Gia_ManIsSeqWithBoxes(p);
  if (iVar1 == 0) {
    nAll = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCis);
      bVar8 = false;
      if (nAll < iVar1) {
        _nCIs = Gia_ManCi(p,nAll);
        bVar8 = _nCIs != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      uVar5 = Gia_ManAppendCi(p_00);
      _nCIs->Value = uVar5;
      nAll = nAll + 1;
    }
  }
  else {
    iVar1 = Tim_ManPiNum((Tim_Man_t *)p->pManTime);
    iVar4 = Tim_ManCiNum((Tim_Man_t *)p->pManTime);
    iVar2 = Gia_ManRegNum(p);
    iVar3 = Gia_ManCiNum(p);
    if (iVar4 != iVar3) {
      __assert_fail("nAll == Gia_ManCiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTim.c"
                    ,0xa1,"Gia_Man_t *Gia_ManDupNormalize(Gia_Man_t *, int)");
    }
    if (iVar1 - iVar2 < 1) {
      __assert_fail("nPis > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTim.c"
                    ,0xa2,"Gia_Man_t *Gia_ManDupNormalize(Gia_Man_t *, int)");
    }
    for (nAll = 0; iVar3 = iVar1, nAll < iVar1 - iVar2; nAll = nAll + 1) {
      uVar5 = Gia_ManAppendCi(p_00);
      pGVar7 = Gia_ManCi(p,nAll);
      pGVar7->Value = uVar5;
    }
    while (nAll = iVar3, nAll < iVar4) {
      uVar5 = Gia_ManAppendCi(p_00);
      pGVar7 = Gia_ManCi(p,nAll);
      pGVar7->Value = uVar5;
      iVar3 = nAll + 1;
    }
    iVar4 = Gia_ManRegNum(p);
    for (nAll = iVar1 - iVar4; nAll < iVar1; nAll = nAll + 1) {
      uVar5 = Gia_ManAppendCi(p_00);
      pGVar7 = Gia_ManCi(p,nAll);
      pGVar7->Value = uVar5;
    }
    printf("Warning: Shuffled CI order to be correct sequential AIG.\n");
  }
  if (fHashMapping != 0) {
    Gia_ManHashAlloc(p_00);
  }
  nAll = 0;
  while( true ) {
    bVar8 = false;
    if (nAll < p->nObjs) {
      _nCIs = Gia_ManObj(p,nAll);
      bVar8 = _nCIs != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    iVar1 = Gia_ObjIsAnd(_nCIs);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjIsBuf(_nCIs);
      if (iVar1 == 0) {
        if (fHashMapping == 0) {
          iVar1 = Gia_ObjFanin0Copy(_nCIs);
          iVar4 = Gia_ObjFanin1Copy(_nCIs);
          uVar5 = Gia_ManAppendAnd(p_00,iVar1,iVar4);
          _nCIs->Value = uVar5;
        }
        else {
          iVar1 = Gia_ObjFanin0Copy(_nCIs);
          iVar4 = Gia_ObjFanin1Copy(_nCIs);
          uVar5 = Gia_ManHashAnd(p_00,iVar1,iVar4);
          _nCIs->Value = uVar5;
        }
      }
      else {
        iVar1 = Gia_ObjFanin0Copy(_nCIs);
        uVar5 = Gia_ManAppendBuf(p_00,iVar1);
        _nCIs->Value = uVar5;
      }
    }
    nAll = nAll + 1;
  }
  if (fHashMapping != 0) {
    Gia_ManHashStop(p_00);
  }
  nAll = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar8 = false;
    if (nAll < iVar1) {
      _nCIs = Gia_ManCo(p,nAll);
      bVar8 = _nCIs != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    iVar1 = Gia_ObjFanin0Copy(_nCIs);
    uVar5 = Gia_ManAppendCo(p_00,iVar1);
    _nCIs->Value = uVar5;
    nAll = nAll + 1;
  }
  iVar1 = Gia_ManRegNum(p);
  Gia_ManSetRegNum(p_00,iVar1);
  p_00->nConstrs = p->nConstrs;
  iVar1 = Gia_ManIsNormalized(p_00);
  if (iVar1 == 0) {
    __assert_fail("Gia_ManIsNormalized(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTim.c"
                  ,0xbb,"Gia_Man_t *Gia_ManDupNormalize(Gia_Man_t *, int)");
  }
  Gia_ManDupRemapEquiv(p_00,p);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupNormalize( Gia_Man_t * p, int fHashMapping )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    if ( !Gia_ManIsSeqWithBoxes(p) )
    {
        Gia_ManForEachCi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi(pNew);
    }
    else
    {
        // current CI order:  PIs + FOs + NewCIs
        // desired reorder:   PIs + NewCIs + FOs
        int nCIs = Tim_ManPiNum( (Tim_Man_t *)p->pManTime );
        int nAll = Tim_ManCiNum( (Tim_Man_t *)p->pManTime );
        int nPis = nCIs - Gia_ManRegNum(p);
        assert( nAll == Gia_ManCiNum(p) );
        assert( nPis > 0 );
        // copy PIs first
        for ( i = 0; i < nPis; i++ )
            Gia_ManCi(p, i)->Value = Gia_ManAppendCi(pNew);
       // copy new CIs second
        for ( i = nCIs; i < nAll; i++ )
            Gia_ManCi(p, i)->Value = Gia_ManAppendCi(pNew);
        // copy flops last
        for ( i = nCIs - Gia_ManRegNum(p); i < nCIs; i++ )
            Gia_ManCi(p, i)->Value = Gia_ManAppendCi(pNew);
        printf( "Warning: Shuffled CI order to be correct sequential AIG.\n" );
    }
    if ( fHashMapping ) Gia_ManHashAlloc( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( fHashMapping )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    if ( fHashMapping ) Gia_ManHashStop( pNew );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew->nConstrs = p->nConstrs;
    assert( Gia_ManIsNormalized(pNew) );
    Gia_ManDupRemapEquiv( pNew, p );
    return pNew;
}